

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.hpp
# Opt level: O1

void __thiscall Symbol::SetValue<int>(Symbol *this,int value)

{
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_20 = 0;
  local_18[0] = 0;
  (this->m_value).value.int_value = value;
  local_28 = local_18;
  std::__cxx11::string::operator=((string *)&(this->m_value).string_value,(string *)&local_28);
  if (local_28 != local_18) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

explicit SymbolValue(int _value) {
        memcpy(&value, &_value, sizeof(int));
    }